

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void __thiscall gnilk::LogManager::IterateSinks(LogManager *this,SinkDelegate *delegate)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *sink;
  pointer puVar3;
  
  std::mutex::lock(&this->sinkLock);
  puVar1 = (this->sinks).
           super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->sinks).
                super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    iVar2 = (*((puVar3->_M_t).
               super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
               ._M_t.
               super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
               .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl)->
              _vptr_LogSinkInstance[2])();
    std::function<bool_(gnilk::LogSink_*)>::operator()
              (delegate,(LogSink *)CONCAT44(extraout_var,iVar2));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->sinkLock);
  return;
}

Assistant:

void LogManager::IterateSinks(const SinkDelegate &delegate) {
    std::lock_guard<std::mutex> lock(sinkLock);
    for(auto &sink : sinks) {
        delegate(sink->GetSink());
    }
}